

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_tried_collisions::test_method(addrman_tried_collisions *this)

{
  _Head_base<0UL,_AddrMan_*,_false> _Var1;
  readonly_property65 rVar2;
  bool bVar3;
  int32_t consistency_check_ratio;
  AddrMan *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  time_point tVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_01;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  uint32_t num_addrs;
  __single_object addrman;
  CService addr2;
  CService addr1;
  CNetAddr source;
  char *pcVar9;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  uint *local_348;
  char *local_340;
  vector<CAddress,_std::allocator<CAddress>_> local_338;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  element_type *local_258;
  shared_count sStack_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 local_228 [8];
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  uint local_1fc;
  _Head_base<0UL,_AddrMan_*,_false> local_1f8;
  direct_or_indirect local_1f0;
  uint local_1e0;
  vector<CAddress,_std::allocator<CAddress>_> *local_1d8;
  uint16_t local_1d0;
  direct_or_indirect local_1c8;
  uint local_1b8;
  vector<CAddress,_std::allocator<CAddress>_> *local_1b0;
  uint16_t local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  uint16_t local_160;
  direct_or_indirect local_158;
  uint local_148;
  uint **local_140;
  uint16_t local_138;
  direct_or_indirect local_130;
  uint local_120;
  uint **local_118;
  uint16_t local_110;
  direct_or_indirect local_108;
  uint local_f8;
  uint **local_f0;
  uint16_t local_e8;
  direct_or_indirect local_e0;
  uint local_d0;
  uint **local_c8;
  uint16_t local_c0;
  direct_or_indirect local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  uint16_t local_98;
  NodeSeconds local_90;
  ServiceFlags local_88;
  direct_or_indirect local_80;
  undefined1 *local_70;
  uint **local_68;
  uint16_t local_60;
  direct_or_indirect local_58;
  uint local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00 = (AddrMan *)operator_new(8);
  AddrMan::AddrMan(this_00,&EMPTY_NETGROUPMAN,true,consistency_check_ratio);
  local_1f8._M_head_impl = this_00;
  local_b8.indirect_contents.indirect = (char *)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,(string *)&local_b8.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.indirect_contents.indirect != &local_a8) {
    operator_delete(local_b8.indirect_contents.indirect,local_a8._M_allocated_capacity + 1);
  }
  local_1fc = 0;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x160;
  file.m_begin = (iterator)&local_210;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_220,msg);
  local_180[8] = false;
  local_180._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_170._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_170._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_228 = (undefined1  [8])
              AddrMan::Size(local_1f8._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_228;
  local_348 = &local_1fc;
  local_1a0[0] = local_228 == (undefined1  [8])(ulong)local_1fc;
  local_1a0._8_8_ = (element_type *)0x0;
  aStack_190._M_allocated_capacity = 0;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_258 = (element_type *)0xe7eadc;
  local_a8._8_8_ = &local_338;
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3cf0;
  local_a8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68 = &local_348;
  local_80.direct[8] = '\0';
  local_80.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  pcVar9 = "addrman->Size()";
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a0,(lazy_ostream *)local_180,1,2,REQUIRE,0xe7eaf6,
             (size_t)&local_260,0x160,&local_b8,"num_addrs",&local_80);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
  if (local_1fc < 0x23) {
    do {
      local_1fc = local_1fc + 1;
      util::ToString<unsigned_int>((string *)local_180,&local_1fc);
      pvVar7 = &DAT_00000008;
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((string *)local_180,0,0,"250.1.1.",8);
      local_b8.indirect_contents.indirect = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.indirect_contents.indirect == paVar6) {
        local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_a8._8_8_ = *(long *)((long)&pbVar4->field_2 + 8);
        local_b8.indirect_contents.indirect = (char *)&local_a8;
      }
      else {
        local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_b8._8_8_ = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      ResolveService((CService *)&local_80.indirect_contents,(string *)&local_b8.indirect_contents,0
                    );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.indirect_contents.indirect != &local_a8) {
        operator_delete(local_b8.indirect_contents.indirect,
                        (ulong)(local_a8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._0_8_ != &local_170) {
        operator_delete((void *)local_180._0_8_,(ulong)(local_170._M_allocated_capacity + 1));
      }
      local_238 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_230 = "";
      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
      local_240 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x164;
      file_00.m_begin = (iterator)&local_238;
      msg_00.m_end = pvVar8;
      msg_00.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
                 msg_00);
      _Var1._M_head_impl = local_1f8._M_head_impl;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e0.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_80.indirect_contents);
      local_c8 = local_68;
      local_c0 = local_60;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e0.indirect_contents);
      local_a8._8_8_ = local_c8;
      local_98 = local_c0;
      local_90.__d.__r = (duration)100000000;
      local_88 = 0;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_b8;
      std::vector<CAddress,_std::allocator<CAddress>_>::vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260,__l,
                 (allocator_type *)&local_348);
      rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_260
                        ,(CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
      local_1a0[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
      local_1a0._8_8_ = (element_type *)0x0;
      aStack_190._M_allocated_capacity = 0;
      local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xe7f48d;
      local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xe7f4be;
      local_180[8] = false;
      local_180._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_170._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_170._8_8_ = &local_338;
      local_270 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_268 = "";
      pvVar8 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a0,(lazy_ostream *)local_180,1,0,WARN,(check_type)pcVar9
                 ,(size_t)&local_270,0x164);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260);
      if (0x10 < (uint)local_a8._M_allocated_capacity._0_4_) {
        free(local_b8.indirect_contents.indirect);
        local_b8.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_d0) {
        free(local_e0.indirect_contents.indirect);
        local_e0.indirect_contents.indirect = (char *)0x0;
      }
      local_280 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_278 = "";
      local_290 = &boost::unit_test::basic_cstring<char_const>::null;
      local_288 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x167;
      file_01.m_begin = (iterator)&local_280;
      msg_01.m_end = pvVar7;
      msg_01.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_290,
                 msg_01);
      _Var1._M_head_impl = local_1f8._M_head_impl;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_80.indirect_contents);
      local_f0 = local_68;
      local_e8 = local_60;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108.indirect_contents);
      local_a8._8_8_ = local_f0;
      local_98 = local_e8;
      local_90.__d.__r = (duration)100000000;
      local_88 = 0;
      tVar5 = NodeClock::now();
      rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           AddrMan::Good(_Var1._M_head_impl,(CService *)&local_b8.indirect_contents,
                         (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
      local_1a0[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
      local_1a0._8_8_ = (element_type *)0x0;
      aStack_190._M_allocated_capacity = 0;
      local_260 = "addrman->Good(CAddress(addr, NODE_NONE))";
      local_258 = (element_type *)0xe7f56c;
      local_180[8] = false;
      local_180._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_170._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_298 = "";
      pvVar8 = (iterator)0x0;
      local_170._8_8_ = (vector<CAddress,_std::allocator<CAddress>_> *)&local_260;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a0,(lazy_ostream *)local_180,1,0,WARN,(check_type)pcVar9
                 ,(size_t)&local_2a0,0x167);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
      if (0x10 < (uint)local_a8._M_allocated_capacity._0_4_) {
        free(local_b8.indirect_contents.indirect);
        local_b8.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_f8) {
        free(local_108.indirect_contents.indirect);
        local_108.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < (uint)local_70) {
        free(local_80.indirect_contents.indirect);
        local_80.indirect_contents.indirect = (char *)0x0;
      }
    } while (local_1fc < 0x23);
  }
  local_1fc = local_1fc + 1;
  util::ToString<unsigned_int>((string *)local_180,&local_1fc);
  pvVar7 = &DAT_00000008;
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180
                      ,0,0,"250.1.1.",8);
  local_b8.indirect_contents.indirect = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.indirect_contents.indirect == paVar6) {
    local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_a8._8_8_ = *(long *)((long)&pbVar4->field_2 + 8);
    local_b8.indirect_contents.indirect = (char *)&local_a8;
  }
  else {
    local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_b8._8_8_ = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  ResolveService((CService *)&local_80.indirect_contents,(string *)&local_b8.indirect_contents,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.indirect_contents.indirect != &local_a8) {
    operator_delete(local_b8.indirect_contents.indirect,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,(ulong)(local_170._M_allocated_capacity + 1));
  }
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x16d;
  file_02.m_begin = (iterator)&local_2b0;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c0,
             msg_02);
  _Var1._M_head_impl = local_1f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_130.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_80.indirect_contents);
  local_118 = local_68;
  local_110 = local_60;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_130.indirect_contents);
  local_a8._8_8_ = local_118;
  local_98 = local_110;
  local_90.__d.__r = (duration)100000000;
  local_88 = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260,__l_00,
             (allocator_type *)&local_348);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_260,
                    (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_1a0[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1a0._8_8_ = (element_type *)0x0;
  aStack_190._M_allocated_capacity = 0;
  local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7eb34;
  local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7eb66;
  local_180[8] = false;
  local_180._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_170._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_170._8_8_ = &local_338;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2c8 = "";
  pvVar8 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a0,(lazy_ostream *)local_180,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_2d0,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_260);
  if (0x10 < (uint)local_a8._M_allocated_capacity._0_4_) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_120) {
    free(local_130.indirect_contents.indirect);
    local_130.indirect_contents.indirect = (char *)0x0;
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x16e;
  file_03.m_begin = (iterator)&local_2e0;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f0,
             msg_03);
  _Var1._M_head_impl = local_1f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_80.indirect_contents);
  local_140 = local_68;
  local_138 = local_60;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158.indirect_contents);
  local_a8._8_8_ = local_140;
  local_98 = local_138;
  local_90.__d.__r = (duration)100000000;
  local_88 = 0;
  tVar5 = NodeClock::now();
  bVar3 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_b8.indirect_contents,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_1a0[0] = !bVar3;
  local_1a0._8_8_ = (element_type *)0x0;
  aStack_190._M_allocated_capacity = 0;
  local_260 = "!addrman->Good(CAddress(addr1, NODE_NONE))";
  local_258 = (element_type *)0xe7f597;
  local_180[8] = false;
  local_180._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_170._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f8 = "";
  pvVar8 = (iterator)0x0;
  local_170._8_8_ = (vector<CAddress,_std::allocator<CAddress>_> *)&local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a0,(lazy_ostream *)local_180,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_300,0x16e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_190._M_allocated_capacity);
  if (0x10 < (uint)local_a8._M_allocated_capacity._0_4_) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_148) {
    free(local_158.indirect_contents.indirect);
    local_158.indirect_contents.indirect = (char *)0x0;
  }
  local_1fc = local_1fc + 1;
  util::ToString<unsigned_int>((string *)local_1a0,&local_1fc);
  pvVar7 = &DAT_00000008;
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0
                      ,0,0,"250.1.1.",8);
  local_b8.indirect_contents.indirect = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.indirect_contents.indirect == paVar6) {
    local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_a8._8_8_ = *(long *)((long)&pbVar4->field_2 + 8);
    local_b8.indirect_contents.indirect = (char *)&local_a8;
  }
  else {
    local_a8._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_b8._8_8_ = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  ResolveService((CService *)local_180,(string *)&local_b8.indirect_contents,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.indirect_contents.indirect != &local_a8) {
    operator_delete(local_b8.indirect_contents.indirect,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != &aStack_190) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(aStack_190._M_allocated_capacity + 1));
  }
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x172;
  file_04.m_begin = (iterator)&local_310;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_320,
             msg_04);
  _Var1._M_head_impl = local_1f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_180);
  local_1b0 = (vector<CAddress,_std::allocator<CAddress>_> *)local_170._8_8_;
  local_1a8 = local_160;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents);
  local_a8._8_8_ = local_1b0;
  local_98 = local_1a8;
  local_90.__d.__r = (duration)100000000;
  local_88 = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_338,__l_01,(allocator_type *)local_228);
  bVar3 = AddrMan::Add(_Var1._M_head_impl,&local_338,(CNetAddr *)&local_58.indirect_contents,
                       (seconds)0x0);
  local_260 = (char *)CONCAT71(local_260._1_7_,bVar3);
  local_258 = (element_type *)0x0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_348 = (uint *)0xe7ebe6;
  local_340 = "";
  local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_190._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_350 = "";
  pvVar8 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  aStack_190._8_8_ = (allocator_type *)&local_348;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_260,(lazy_ostream *)local_1a0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_358,0x172);
  boost::detail::shared_count::~shared_count(&sStack_250);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_338);
  if (0x10 < (uint)local_a8._M_allocated_capacity._0_4_) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1b8) {
    free(local_1c8.indirect_contents.indirect);
    local_1c8.indirect_contents.indirect = (char *)0x0;
  }
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x173;
  file_05.m_begin = (iterator)&local_368;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_378,
             msg_05);
  _Var1._M_head_impl = local_1f8._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_180);
  local_1d8 = (vector<CAddress,_std::allocator<CAddress>_> *)local_170._8_8_;
  local_1d0 = local_160;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents);
  local_a8._8_8_ = local_1d8;
  local_98 = local_1d0;
  local_90.__d.__r = (duration)100000000;
  local_88 = 0;
  tVar5 = NodeClock::now();
  bVar3 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_b8.indirect_contents,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_260 = (char *)CONCAT71(local_260._1_7_,bVar3);
  local_258 = (element_type *)0x0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe7f598;
  local_338.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7f5c1;
  local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_190._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_380 = "";
  aStack_190._8_8_ = &local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_260,(lazy_ostream *)local_1a0,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_388,0x173);
  boost::detail::shared_count::~shared_count(&sStack_250);
  if (0x10 < (uint)local_a8._M_allocated_capacity._0_4_) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1e0) {
    free(local_1f0.indirect_contents.indirect);
    local_1f0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)local_170._M_allocated_capacity._0_4_) {
    free((void *)local_180._0_8_);
    local_180._0_8_ = (_func_int **)0x0;
  }
  if (0x10 < (uint)local_70) {
    free(local_80.indirect_contents.indirect);
    local_80.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_tried_collisions)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    uint32_t num_addrs{0};

    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);

    while (num_addrs < 35) { // Magic number! 250.1.1.1 - 250.1.1.35 do not collide in tried with deterministic key = 1
        CService addr = ResolveService("250.1.1." + ToString(++num_addrs));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // Test: Add to tried without collision
        BOOST_CHECK(addrman->Good(CAddress(addr, NODE_NONE)));

    }

    // Test: Unable to add to tried table due to collision!
    CService addr1 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK(!addrman->Good(CAddress(addr1, NODE_NONE)));

    // Test: Add the next address to tried without collision
    CService addr2 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK(addrman->Good(CAddress(addr2, NODE_NONE)));
}